

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall libcellml::Importer::~Importer(Importer *this)

{
  ImporterImpl *this_00;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Importer_0029fe18;
  (this->super_Strict)._vptr_Strict = (_func_int **)&DAT_0029fe38;
  this_00 = (ImporterImpl *)Logger::pFunc(&this->super_Logger);
  if (this_00 != (ImporterImpl *)0x0) {
    ImporterImpl::~ImporterImpl(this_00);
  }
  operator_delete(this_00,0xb0);
  Strict::~Strict(&this->super_Strict);
  Logger::~Logger(&this->super_Logger);
  return;
}

Assistant:

Importer::~Importer()
{
    delete pFunc();
}